

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<InterfaceVariableRename,_8UL>::reserve
          (SmallVector<InterfaceVariableRename,_8UL> *this,size_t count)

{
  char *pcVar1;
  undefined8 *puVar2;
  InterfaceVariableRename *pIVar3;
  undefined8 *puVar4;
  void *pvVar5;
  undefined8 uVar6;
  ulong uVar7;
  InterfaceVariableRename *pIVar8;
  long lVar9;
  ulong uVar10;
  
  if (count < 0x666666666666667) {
    uVar7 = this->buffer_capacity;
    if (uVar7 < count) {
      uVar10 = 8;
      if (8 < uVar7) {
        uVar10 = uVar7;
      }
      do {
        uVar7 = uVar10;
        uVar10 = uVar7 * 2;
      } while (uVar7 < count);
      if (uVar7 < 9) {
        pIVar8 = (InterfaceVariableRename *)&this->stack_storage;
      }
      else {
        pIVar8 = (InterfaceVariableRename *)malloc(uVar7 * 0x28);
      }
      if (pIVar8 == (InterfaceVariableRename *)0x0) goto LAB_001d27df;
      if ((pIVar8 != (this->super_VectorView<InterfaceVariableRename>).ptr) &&
         ((this->super_VectorView<InterfaceVariableRename>).buffer_size != 0)) {
        lVar9 = 0x18;
        uVar10 = 0;
        do {
          pcVar1 = (char *)((long)&pIVar8->storageClass + lVar9);
          pIVar3 = (this->super_VectorView<InterfaceVariableRename>).ptr;
          puVar2 = (undefined8 *)((long)&pIVar3->storageClass + lVar9);
          *(undefined8 *)((long)pIVar8 + lVar9 + -0x18) =
               *(undefined8 *)((long)pIVar3 + lVar9 + -0x18);
          *(char **)((long)pIVar8 + lVar9 + -0x10) = pcVar1;
          puVar4 = *(undefined8 **)((long)pIVar3 + lVar9 + -0x10);
          if (puVar2 == puVar4) {
            uVar6 = puVar2[1];
            *(undefined8 *)pcVar1 = *puVar2;
            *(undefined8 *)(pcVar1 + 8) = uVar6;
          }
          else {
            *(undefined8 **)((long)pIVar8 + lVar9 + -0x10) = puVar4;
            *(undefined8 *)((long)&pIVar8->storageClass + lVar9) = *puVar2;
          }
          *(undefined8 *)((long)pIVar8 + lVar9 + -8) = *(undefined8 *)((long)pIVar3 + lVar9 + -8);
          *(undefined8 **)((long)pIVar3 + lVar9 + -0x10) = puVar2;
          *(undefined8 *)((long)pIVar3 + lVar9 + -8) = 0;
          *(undefined1 *)((long)&pIVar3->storageClass + lVar9) = 0;
          pIVar3 = (this->super_VectorView<InterfaceVariableRename>).ptr;
          pvVar5 = *(void **)((long)pIVar3 + lVar9 + -0x10);
          if ((void *)((long)&pIVar3->storageClass + lVar9) != pvVar5) {
            operator_delete(pvVar5);
          }
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x28;
        } while (uVar10 < (this->super_VectorView<InterfaceVariableRename>).buffer_size);
      }
      pIVar3 = (this->super_VectorView<InterfaceVariableRename>).ptr;
      if (pIVar3 != (InterfaceVariableRename *)&this->stack_storage) {
        free(pIVar3);
      }
      (this->super_VectorView<InterfaceVariableRename>).ptr = pIVar8;
      this->buffer_capacity = uVar7;
    }
    return;
  }
LAB_001d27df:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}